

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommands.cxx
# Opt level: O2

void GetPredefinedCommands(vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands)

{
  cmExportCommand *pcVar1;
  cmExportCommand *local_38;
  
  local_38 = (cmExportCommand *)operator_new(0x50);
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_006704a0
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00670530
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_006705c0
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00670650
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_006706e0
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(800);
  cmExportCommand::cmExportCommand(pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x78);
  cmExportLibraryDependenciesCommand::cmExportLibraryDependenciesCommand
            ((cmExportLibraryDependenciesCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x88);
  cmFLTKWrapUICommand::cmFLTKWrapUICommand((cmFLTKWrapUICommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_006708a8
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0xa0);
  cmInstallProgramsCommand::cmInstallProgramsCommand((cmInstallProgramsCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_006709c8
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0xa0);
  cmLoadCacheCommand::cmLoadCacheCommand((cmLoadCacheCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x90);
  cmOutputRequiredFilesCommand::cmOutputRequiredFilesCommand((cmOutputRequiredFilesCommand *)pcVar1)
  ;
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00670bd0
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00670c60
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00670cf0
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00670d80
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00670e10
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00670ea0
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x78);
  cmTargetCompileDefinitionsCommand::cmTargetCompileDefinitionsCommand
            ((cmTargetCompileDefinitionsCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x78);
  cmTargetCompileFeaturesCommand::cmTargetCompileFeaturesCommand
            ((cmTargetCompileFeaturesCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x78);
  cmTargetCompileOptionsCommand::cmTargetCompileOptionsCommand
            ((cmTargetCompileOptionsCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x78);
  cmTargetIncludeDirectoriesCommand::cmTargetIncludeDirectoriesCommand
            ((cmTargetIncludeDirectoriesCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x78);
  cmTargetSourcesCommand::cmTargetSourcesCommand((cmTargetSourcesCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_006712c8
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00671358
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_006713e8
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x80);
  cmVariableWatchCommand::cmVariableWatchCommand((cmVariableWatchCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00671490
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00671520
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  return;
}

Assistant:

void GetPredefinedCommands(std::vector<cmCommand*>& commands)
{
commands.push_back(new cmAddCompileOptionsCommand);
commands.push_back(new cmAuxSourceDirectoryCommand);
commands.push_back(new cmBuildNameCommand);
commands.push_back(new cmCMakeHostSystemInformationCommand);
commands.push_back(new cmElseIfCommand);
commands.push_back(new cmExportCommand);
commands.push_back(new cmExportLibraryDependenciesCommand);
commands.push_back(new cmFLTKWrapUICommand);
commands.push_back(new cmIncludeExternalMSProjectCommand);
commands.push_back(new cmInstallProgramsCommand);
commands.push_back(new cmLinkLibrariesCommand);
commands.push_back(new cmLoadCacheCommand);
commands.push_back(new cmOutputRequiredFilesCommand);
commands.push_back(new cmQTWrapCPPCommand);
commands.push_back(new cmQTWrapUICommand);
commands.push_back(new cmRemoveCommand);
commands.push_back(new cmRemoveDefinitionsCommand);
commands.push_back(new cmSourceGroupCommand);
commands.push_back(new cmSubdirDependsCommand);
commands.push_back(new cmTargetCompileDefinitionsCommand);
commands.push_back(new cmTargetCompileFeaturesCommand);
commands.push_back(new cmTargetCompileOptionsCommand);
commands.push_back(new cmTargetIncludeDirectoriesCommand);
commands.push_back(new cmTargetSourcesCommand);
commands.push_back(new cmUseMangledMesaCommand);
commands.push_back(new cmUtilitySourceCommand);
commands.push_back(new cmVariableRequiresCommand);
commands.push_back(new cmVariableWatchCommand);
commands.push_back(new cmWriteFileCommand);
commands.push_back(new cmLoadCommandCommand);

}